

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O1

double ** New2DArray<double>(uint f,uint s)

{
  double **ppdVar1;
  double *pdVar2;
  ulong uVar3;
  
  ppdVar1 = (double **)operator_new__((ulong)f * 8);
  pdVar2 = (double *)operator_new__((ulong)(s * f) << 3);
  *ppdVar1 = pdVar2;
  if (1 < f) {
    pdVar2 = *ppdVar1;
    uVar3 = 1;
    do {
      pdVar2 = pdVar2 + s;
      ppdVar1[uVar3] = pdVar2;
      uVar3 = uVar3 + 1;
    } while (f != uVar3);
  }
  return ppdVar1;
}

Assistant:

T **New2DArray(unsigned f , unsigned s)
{
	T **temp;
	temp = new T *[f];
	*temp = new T [f * s];
	for (unsigned fIt = 1 ; fIt < f ; fIt ++)
		temp[fIt] = temp[fIt -1] +  s ;
	return temp;
}